

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::getProgramInterface
          (SSBMemberOffsetAndAlignTest *this,GLuint test_case_index,
          ProgramInterface *program_interface,VaryingPassthrough *varying_passthrough)

{
  undefined4 type_00;
  reference pvVar1;
  const_reference pvVar2;
  size_type sVar3;
  void *pvVar4;
  Interface *this_00;
  ShaderInterface *this_01;
  size_type data_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  ShaderInterface *vs_si;
  Interface *vs_buf_block;
  GLchar buffer [16];
  size_t local_140;
  size_t position;
  GLubyte *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *fourth;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *third;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *second;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *first;
  GLuint local_a8;
  GLuint eigth_offset;
  GLuint seventh_offset;
  GLuint sixth_offset;
  GLuint fifth_offset;
  GLuint fourth_offset;
  GLuint third_offset;
  GLuint second_offset;
  GLuint first_offset;
  GLuint type_align;
  GLuint base_stride;
  GLuint array_align;
  GLuint base_align;
  GLuint basic_size;
  GLuint local_70;
  undefined1 local_68 [8];
  Type type;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string globals;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *program_interface_local;
  GLuint test_case_index_local;
  SSBMemberOffsetAndAlignTest *this_local;
  
  globals.field_2._8_8_ = varying_passthrough;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,
             "const int basic_size = BASIC_SIZE;\nconst int type_align = TYPE_ALIGN;\nconst int type_size  = TYPE_SIZE;\n"
             ,&local_49);
  std::allocator<char>::~allocator(&local_49);
  _base_align = TestBase::getType((TestBase *)this,test_case_index);
  type.m_basic_type = base_align._8_4_;
  local_68._0_4_ = base_align;
  type_00 = local_68._0_4_;
  local_68 = (undefined1  [8])(long)base_align;
  array_align = Utils::Type::GetTypeSize(type_00);
  base_stride = Utils::Type::GetBaseAlignment((Type *)local_68,false);
  type_align = Utils::Type::GetBaseAlignment((Type *)local_68,true);
  first_offset = Utils::Type::CalculateStd140Stride(base_stride,local_68._4_4_,0);
  second_offset = Utils::roundUpToPowerOf2(first_offset);
  third_offset = 0;
  fourth_offset = Utils::Type::GetActualOffset(first_offset,array_align >> 1);
  fifth_offset = Utils::Type::GetActualOffset(fourth_offset + first_offset,second_offset * 2);
  sixth_offset = Utils::Type::GetActualOffset(second_offset * 3 + first_offset,base_stride);
  seventh_offset = Utils::Type::GetActualOffset(sixth_offset + first_offset,base_stride);
  eigth_offset = Utils::Type::GetActualOffset(seventh_offset + first_offset,type_align);
  local_a8 = Utils::Type::GetActualOffset(eigth_offset + first_offset,type_align);
  first._4_4_ = Utils::Type::GetActualOffset(local_a8 + first_offset,array_align << 3);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&second,(Type *)local_68);
  local_b8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&second;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&third,(Type *)local_68);
  local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&third;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fourth,(Type *)local_68);
  local_f8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fourth;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr,(Type *)local_68);
  local_118 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_data,(ulong)(first._4_4_ + first_offset));
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0);
  position = (size_t)pvVar1;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_b8,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_b8);
  memcpy(pvVar1,pvVar2,sVar3);
  pvVar4 = (void *)(position + fourth_offset);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d8,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
  memcpy(pvVar4,pvVar2,sVar3);
  pvVar4 = (void *)(position + fifth_offset);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_f8,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_f8);
  memcpy(pvVar4,pvVar2,sVar3);
  pvVar4 = (void *)(position + sixth_offset);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_118,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_118);
  memcpy(pvVar4,pvVar2,sVar3);
  pvVar4 = (void *)(position + seventh_offset);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_118,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_118);
  memcpy(pvVar4,pvVar2,sVar3);
  pvVar4 = (void *)(position + eigth_offset);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_f8,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_f8);
  memcpy(pvVar4,pvVar2,sVar3);
  pvVar4 = (void *)(position + local_a8);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d8,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
  memcpy(pvVar4,pvVar2,sVar3);
  pvVar4 = (void *)(position + first._4_4_);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_b8,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_b8);
  memcpy(pvVar4,pvVar2,sVar3);
  local_140 = 0;
  sprintf((char *)&vs_buf_block,"%d",(ulong)array_align);
  Utils::replaceToken("BASIC_SIZE",&local_140,(GLchar *)&vs_buf_block,(string *)local_48);
  sprintf((char *)&vs_buf_block,"%d",(ulong)second_offset);
  Utils::replaceToken("TYPE_ALIGN",&local_140,(GLchar *)&vs_buf_block,(string *)local_48);
  sprintf((char *)&vs_buf_block,"%d",(ulong)first_offset);
  Utils::replaceToken("TYPE_SIZE",&local_140,(GLchar *)&vs_buf_block,(string *)local_48);
  this_00 = Utils::ProgramInterface::Block(program_interface,"vs_buf_Block");
  Utils::Interface::Member
            (this_00,"at_first_offset","layout(offset = 0, align = 8 * basic_size)",0,0,
             (Type *)local_68,'\0',0,first_offset,0);
  Utils::Interface::Member
            (this_00,"at_second_offset","layout(offset = type_size, align = basic_size / 2)",0,0,
             (Type *)local_68,'\0',0,first_offset,fourth_offset);
  Utils::Interface::Member
            (this_00,"at_third_offset","layout(align = 2 * type_align)",0,0,(Type *)local_68,'\0',0,
             first_offset,fifth_offset);
  Utils::Interface::Member
            (this_00,"at_fourth_offset","layout(offset = 3 * type_align + type_size)",0,0,
             (Type *)local_68,'\0',0,first_offset,sixth_offset);
  Utils::Interface::Member
            (this_00,"at_fifth_offset","",0,0,(Type *)local_68,'\0',0,first_offset,seventh_offset);
  Utils::Interface::Member
            (this_00,"at_sixth_offset","",0,0,(Type *)local_68,'\0',2,type_align * 2,eigth_offset);
  Utils::Interface::Member
            (this_00,"at_eigth_offset","layout(align = 8 * basic_size)",0,0,(Type *)local_68,'\0',0,
             first_offset,first._4_4_);
  this_01 = Utils::ProgramInterface::GetShaderInterface(program_interface,VERTEX);
  std::__cxx11::string::operator=((string *)this_01,(string *)local_48);
  this_02 = &this->m_data;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_02);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_02,0);
  data_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_02);
  Utils::ShaderInterface::SSB<unsigned_char>
            (this_01,"vs_buf_block","layout (std140, binding = BINDING)",0,0,this_00,0,(GLint)sVar3,
             0,pvVar1,data_size);
  Utils::ProgramInterface::CloneVertexInterface
            (program_interface,(VaryingPassthrough *)globals.field_2._8_8_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ptr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fourth);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&third);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&second);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void SSBMemberOffsetAndAlignTest::getProgramInterface(GLuint					 test_case_index,
													  Utils::ProgramInterface&   program_interface,
													  Utils::VaryingPassthrough& varying_passthrough)
{
	std::string globals = "const int basic_size = BASIC_SIZE;\n"
						  "const int type_align = TYPE_ALIGN;\n"
						  "const int type_size  = TYPE_SIZE;\n";

	Utils::Type  type		 = getType(test_case_index);
	GLuint		 basic_size  = Utils::Type::GetTypeSize(type.m_basic_type);
	const GLuint base_align  = type.GetBaseAlignment(false);
	const GLuint array_align = type.GetBaseAlignment(true);
	const GLuint base_stride = Utils::Type::CalculateStd140Stride(base_align, type.m_n_columns, 0);
	const GLuint type_align  = Utils::roundUpToPowerOf2(base_stride);

	/* Calculate offsets */
	const GLuint first_offset  = 0;
	const GLuint second_offset = type.GetActualOffset(base_stride, basic_size / 2);

#if WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST

	const GLuint third_offset   = type.GetActualOffset(second_offset + base_stride, base_align);
	const GLuint fourth_offset  = type.GetActualOffset(third_offset + base_stride, base_align);
	const GLuint fifth_offset   = type.GetActualOffset(fourth_offset + base_stride, base_align);
	const GLuint sixth_offset   = type.GetActualOffset(fifth_offset + base_stride, array_align);
	const GLuint seventh_offset = type.GetActualOffset(sixth_offset + base_stride, array_align);
	const GLuint eigth_offset   = type.GetActualOffset(seventh_offset + base_stride, array_align);

#else /* WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST */

	const GLuint third_offset   = type.GetActualOffset(second_offset + base_stride, 2 * type_align);
	const GLuint fourth_offset  = type.GetActualOffset(3 * type_align + base_stride, base_align);
	const GLuint fifth_offset   = type.GetActualOffset(fourth_offset + base_stride, base_align);
	const GLuint sixth_offset   = type.GetActualOffset(fifth_offset + base_stride, array_align);
	const GLuint seventh_offset = type.GetActualOffset(sixth_offset + base_stride, array_align);
	const GLuint eigth_offset   = type.GetActualOffset(seventh_offset + base_stride, 8 * basic_size);

#endif /* WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST */

	/* Prepare data */
	const std::vector<GLubyte>& first  = type.GenerateData();
	const std::vector<GLubyte>& second = type.GenerateData();
	const std::vector<GLubyte>& third  = type.GenerateData();
	const std::vector<GLubyte>& fourth = type.GenerateData();

	m_data.resize(eigth_offset + base_stride);
	GLubyte* ptr = &m_data[0];
	memcpy(ptr + first_offset, &first[0], first.size());
	memcpy(ptr + second_offset, &second[0], second.size());
	memcpy(ptr + third_offset, &third[0], third.size());
	memcpy(ptr + fourth_offset, &fourth[0], fourth.size());
	memcpy(ptr + fifth_offset, &fourth[0], fourth.size());
	memcpy(ptr + sixth_offset, &third[0], third.size());
	memcpy(ptr + seventh_offset, &second[0], second.size());
	memcpy(ptr + eigth_offset, &first[0], first.size());

	/* Prepare globals */
	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", basic_size);
	Utils::replaceToken("BASIC_SIZE", position, buffer, globals);

	sprintf(buffer, "%d", type_align);
	Utils::replaceToken("TYPE_ALIGN", position, buffer, globals);

	sprintf(buffer, "%d", base_stride);
	Utils::replaceToken("TYPE_SIZE", position, buffer, globals);

	/* Prepare Block */
	Utils::Interface* vs_buf_block = program_interface.Block("vs_buf_Block");

	vs_buf_block->Member("at_first_offset", "layout(offset = 0, align = 8 * basic_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 first_offset);

	vs_buf_block->Member("at_second_offset", "layout(offset = type_size, align = basic_size / 2)",
						 0 /* expected_component */, 0 /* expected_location */, type, false /* normalized */,
						 0 /* n_array_elements */, base_stride, second_offset);

	vs_buf_block->Member("at_third_offset", "layout(align = 2 * type_align)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 third_offset);

	vs_buf_block->Member("at_fourth_offset", "layout(offset = 3 * type_align + type_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 fourth_offset);

	vs_buf_block->Member("at_fifth_offset", "", 0 /* expected_component */, 0 /* expected_location */, type,
						 false /* normalized */, 0 /* n_array_elements */, base_stride, fifth_offset);

	vs_buf_block->Member("at_sixth_offset", "", 0 /* expected_component */, 0 /* expected_location */, type,
						 false /* normalized */, 2 /* n_array_elements */, array_align * 2, sixth_offset);

	vs_buf_block->Member("at_eigth_offset", "layout(align = 8 * basic_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 eigth_offset);

	Utils::ShaderInterface& vs_si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Add globals */
	vs_si.m_globals = globals;

	/* Add uniform BLOCK */
	vs_si.SSB("vs_buf_block", "layout (std140, binding = BINDING)", 0, 0, vs_buf_block, 0,
			  static_cast<GLuint>(m_data.size()), 0, &m_data[0], m_data.size());

	/* */
	program_interface.CloneVertexInterface(varying_passthrough);
}